

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_types.cpp
# Opt level: O2

void BanMapFromJson(UniValue *bans_json,banmap_t *bans)

{
  long lVar1;
  pointer pUVar2;
  bool bVar3;
  int iVar4;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar5;
  UniValue *pUVar6;
  string *subnet_str;
  pointer this;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  CBanEntry local_90;
  int version;
  CSubNet subnet;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar5 = UniValue::getValues(bans_json);
  pUVar2 = (pvVar5->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (this = (pvVar5->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
              super__Vector_impl_data._M_start; this != pUVar2; this = this + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&subnet,"version",(allocator<char> *)&local_90);
    pUVar6 = UniValue::operator[](this,(string *)&subnet);
    iVar4 = UniValue::getInt<int>(pUVar6);
    std::__cxx11::string::~string((string *)&subnet);
    version = iVar4;
    if (iVar4 == 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&subnet,"address",(allocator<char> *)&local_90);
      pUVar6 = UniValue::operator[](this,(string *)&subnet);
      subnet_str = UniValue::get_str_abi_cxx11_(pUVar6);
      std::__cxx11::string::~string((string *)&subnet);
      LookupSubNet(&subnet,subnet_str);
      bVar3 = CSubNet::IsValid(&subnet);
      if (bVar3) {
        CBanEntry::CBanEntry(&local_90,this);
        std::
        map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
        ::insert_or_assign<CBanEntry>(bans,&subnet,&local_90);
      }
      else {
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_types.cpp"
        ;
        source_file_00._M_len = 0x5d;
        logging_function_00._M_str = "BanMapFromJson";
        logging_function_00._M_len = 0xe;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function_00,source_file_00,0x45,ALL,Info,
                   (ConstevalFormatString<1U>)0xe35de9,subnet_str);
      }
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
    }
    else {
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_types.cpp"
      ;
      source_file._M_len = 0x5d;
      logging_function._M_str = "BanMapFromJson";
      logging_function._M_len = 0xe;
      LogPrintFormatInternal<int>
                (logging_function,source_file,0x3f,ALL,Info,(ConstevalFormatString<1U>)0xe35db1,
                 &version);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BanMapFromJson(const UniValue& bans_json, banmap_t& bans)
{
    for (const auto& ban_entry_json : bans_json.getValues()) {
        const int version{ban_entry_json[BANMAN_JSON_VERSION_KEY].getInt<int>()};
        if (version != CBanEntry::CURRENT_VERSION) {
            LogPrintf("Dropping entry with unknown version (%s) from ban list\n", version);
            continue;
        }
        const auto& subnet_str = ban_entry_json[BANMAN_JSON_ADDR_KEY].get_str();
        const CSubNet subnet{LookupSubNet(subnet_str)};
        if (!subnet.IsValid()) {
            LogPrintf("Dropping entry with unparseable address or subnet (%s) from ban list\n", subnet_str);
            continue;
        }
        bans.insert_or_assign(subnet, CBanEntry{ban_entry_json});
    }
}